

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat_test.cc
# Opt level: O2

void leveldb::_Test_InternalKeyShortSeparator::_RunIt(void)

{
  allocator aStack_28b;
  allocator aStack_28a;
  allocator aStack_289;
  string sStack_288;
  string sStack_268;
  string sStack_248;
  string sStack_228;
  string sStack_208;
  string sStack_1e8;
  string sStack_1c8;
  Tester TStack_1a8;
  
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,0x4d);
  std::__cxx11::string::string((string *)&sStack_1e8,"foo",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foo",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"foo",&aStack_28b);
  IKey(&sStack_268,&sStack_288,99,kTypeValue);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,0x50);
  std::__cxx11::string::string((string *)&sStack_1e8,"foo",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foo",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"foo",&aStack_28b);
  IKey(&sStack_268,&sStack_288,0x65,kTypeValue);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,0x53);
  std::__cxx11::string::string((string *)&sStack_1e8,"foo",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foo",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"foo",&aStack_28b);
  IKey(&sStack_268,&sStack_288,100,kTypeValue);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,0x56);
  std::__cxx11::string::string((string *)&sStack_1e8,"foo",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foo",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"foo",&aStack_28b);
  IKey(&sStack_268,&sStack_288,100,kTypeDeletion);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,0x5a);
  std::__cxx11::string::string((string *)&sStack_1e8,"foo",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foo",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"bar",&aStack_28b);
  IKey(&sStack_268,&sStack_288,99,kTypeValue);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,0x5f);
  std::__cxx11::string::string((string *)&sStack_1e8,"g",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,0xffffffffffffff,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foo",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"hello",&aStack_28b);
  IKey(&sStack_268,&sStack_288,200,kTypeValue);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,100);
  std::__cxx11::string::string((string *)&sStack_1e8,"foo",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foo",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"foobar",&aStack_28b);
  IKey(&sStack_268,&sStack_288,200,kTypeValue);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
             ,0x69);
  std::__cxx11::string::string((string *)&sStack_1e8,"foobar",&aStack_289);
  IKey(&sStack_1c8,&sStack_1e8,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_248,"foobar",&aStack_28a);
  IKey(&sStack_228,&sStack_248,100,kTypeValue);
  std::__cxx11::string::string((string *)&sStack_288,"foo",&aStack_28b);
  IKey(&sStack_268,&sStack_288,200,kTypeValue);
  Shorten(&sStack_208,&sStack_228,&sStack_268);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1a8,&sStack_1c8,&sStack_208)
  ;
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_268);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  test::Tester::~Tester(&TStack_1a8);
  return;
}

Assistant:

TEST(FormatTest, InternalKeyShortSeparator) {
  // When user keys are same
  ASSERT_EQ(IKey("foo", 100, kTypeValue),
            Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 99, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 101, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 100, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 100, kTypeDeletion)));

  // When user keys are misordered
  ASSERT_EQ(IKey("foo", 100, kTypeValue),
            Shorten(IKey("foo", 100, kTypeValue), IKey("bar", 99, kTypeValue)));

  // When user keys are different, but correctly ordered
  ASSERT_EQ(
      IKey("g", kMaxSequenceNumber, kValueTypeForSeek),
      Shorten(IKey("foo", 100, kTypeValue), IKey("hello", 200, kTypeValue)));

  // When start user key is prefix of limit user key
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foobar", 200, kTypeValue)));

  // When limit user key is prefix of start user key
  ASSERT_EQ(
      IKey("foobar", 100, kTypeValue),
      Shorten(IKey("foobar", 100, kTypeValue), IKey("foo", 200, kTypeValue)));
}